

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

bool soul::shouldShow(Function *f)

{
  bool bVar1;
  Comment local_50;
  Function *local_10;
  Function *f_local;
  
  local_10 = f;
  getComment(&local_50,&(f->super_ASTObject).context);
  bVar1 = shouldIncludeComment(&local_50);
  SourceCodeUtilities::Comment::~Comment(&local_50);
  return bVar1;
}

Assistant:

static bool shouldShow (const AST::Function& f)
{
    return shouldIncludeComment (getComment (f.context));
}